

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viterbi.cpp
# Opt level: O3

bool MeCab::Viterbi::initNBest(Lattice *lattice)

{
  int iVar1;
  undefined4 extraout_var;
  NBestGenerator *this;
  
  iVar1 = (*lattice->_vptr_Lattice[0x12])(lattice,2);
  if ((char)iVar1 != '\0') {
    iVar1 = (*lattice->_vptr_Lattice[0x16])(lattice);
    this = *(NBestGenerator **)(CONCAT44(extraout_var,iVar1) + 0x48);
    if (this == (NBestGenerator *)0x0) {
      this = (NBestGenerator *)operator_new(0x60);
      this->_vptr_NBestGenerator = (_func_int **)&PTR__NBestGenerator_00140aa8;
      (this->agenda_).c.
      super__Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (this->agenda_).c.
      super__Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (this->agenda_).c.
      super__Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (this->freelist_)._vptr_FreeList = (_func_int **)&PTR__FreeList_00140ad8;
      (this->freelist_).freeList.
      super__Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (this->freelist_).freeList.
      super__Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (this->freelist_).freeList.
      super__Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (this->freelist_).pi_ = 0;
      (this->freelist_).li_ = 0;
      (this->freelist_).size = 0x200;
      *(NBestGenerator **)(CONCAT44(extraout_var,iVar1) + 0x48) = this;
    }
    NBestGenerator::set(this,lattice);
  }
  return true;
}

Assistant:

bool Viterbi::initNBest(Lattice *lattice) {
  if (!lattice->has_request_type(MECAB_NBEST)) {
    return true;
  }
  lattice->allocator()->nbest_generator()->set(lattice);
  return true;
}